

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::struct_builder::~struct_builder(struct_builder *this)

{
  long in_RDI;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_00000040;
  
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque(in_stack_00000040)
  ;
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x576d6a);
  std::__cxx11::string::~string((string *)(in_RDI + 0x20));
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x576d82);
  return;
}

Assistant:

~struct_builder() = default;